

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::worker_thread(PathTracer *this)

{
  FILE *__stream;
  __int_type _Var1;
  bool local_39;
  undefined1 local_30 [8];
  WorkItem work;
  Timer timer;
  PathTracer *this_local;
  
  Timer::Timer((Timer *)&work.tile_w);
  Timer::start((Timer *)&work.tile_w);
  WorkItem::WorkItem((WorkItem *)local_30);
  while( true ) {
    local_39 = false;
    if ((this->continueRaytracing & 1U) != 0) {
      local_39 = WorkQueue<CMU462::WorkItem>::try_get_work(&this->workQueue,(WorkItem *)local_30);
    }
    if (local_39 == false) break;
    raytrace_tile(this,local_30._0_4_,local_30._4_4_,work.tile_x,work.tile_y);
  }
  std::__atomic_base<int>::operator++(&(this->workerDoneCount).super___atomic_base<int>,0);
  if ((this->continueRaytracing & 1U) == 0) {
    _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->workerDoneCount);
    if ((long)_Var1 == this->numWorkerThreads) {
      Timer::stop((Timer *)&work.tile_w);
      fprintf(_stdout,"Canceled!\n");
      this->state = READY;
    }
  }
  if ((this->continueRaytracing & 1U) != 0) {
    _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->workerDoneCount);
    if ((long)_Var1 == this->numWorkerThreads) {
      Timer::stop((Timer *)&work.tile_w);
      __stream = _stdout;
      Timer::duration((Timer *)&work.tile_w);
      fprintf(__stream,"Done! (%.4fs)\n");
      this->state = DONE;
    }
  }
  return;
}

Assistant:

void PathTracer::worker_thread() {

    Timer timer;
    timer.start();

    WorkItem work;
    while (continueRaytracing && workQueue.try_get_work(&work)) {
      raytrace_tile(work.tile_x, work.tile_y, work.tile_w, work.tile_h);
    }

    workerDoneCount++;
    if (!continueRaytracing && workerDoneCount == numWorkerThreads) {
      timer.stop();
      fprintf(stdout, "Canceled!\n");
      state = READY;
    }

    if (continueRaytracing && workerDoneCount == numWorkerThreads) {
      timer.stop();
      fprintf(stdout, "Done! (%.4fs)\n", timer.duration());
      state = DONE;
    }
  }